

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O3

CScript * BuildScript<int_const&>(CScript *__return_storage_ptr__,int *inputs)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x10) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x18) = 0;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = 0;
  CScript::push_int64(__return_storage_ptr__,(long)*inputs);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CScript BuildScript(Ts&&... inputs)
{
    CScript ret;
    int cnt{0};

    ([&ret, &cnt] (Ts&& input) {
        if constexpr (std::is_same_v<std::remove_cv_t<std::remove_reference_t<Ts>>, CScript>) {
            // If it is a CScript, extend ret with it. Move or copy the first element instead.
            if (cnt == 0) {
                ret = std::forward<Ts>(input);
            } else {
                ret.insert(ret.end(), input.begin(), input.end());
            }
        } else {
            // Otherwise invoke CScript::operator<<.
            ret << input;
        }
        cnt++;
    } (std::forward<Ts>(inputs)), ...);

    return ret;
}